

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManProfileCollect
               (Gia_Man_t *p,int i,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets,Vec_Int_t *vArray)

{
  int iVar1;
  undefined4 local_34;
  int k;
  Vec_Int_t *vArray_local;
  Vec_Int_t *vCodeOffsets_local;
  Vec_Int_t *vCode_local;
  int i_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vArray);
  local_34 = Vec_IntEntry(vCodeOffsets,i);
  while( true ) {
    iVar1 = Vec_IntEntry(vCodeOffsets,i + 1);
    if (iVar1 <= local_34) break;
    iVar1 = Vec_IntEntry(vCode,local_34);
    Vec_IntPush(vArray,iVar1);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Gia_ManProfileCollect( Gia_Man_t * p, int i, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets, Vec_Int_t * vArray )
{
    int k;
    Vec_IntClear( vArray );
    for ( k = Vec_IntEntry(vCodeOffsets, i); k < Vec_IntEntry(vCodeOffsets, i+1); k++ )
        Vec_IntPush( vArray, Vec_IntEntry(vCode, k) );
}